

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

QString * __thiscall
CPP::WriteInitialization::Item::writeSetupUi
          (QString *__return_storage_ptr__,Item *this,QString *parent,
          EmptyItemPolicy emptyItemPolicy)

{
  QString *pQVar1;
  QString *pQVar2;
  TemporaryVariableGeneratorPolicy TVar3;
  Driver *this_00;
  Item **ppIVar4;
  long lVar5;
  bool bVar6;
  Language LVar7;
  QTextStream *pQVar8;
  QMapData<std::multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
  *pQVar9;
  _Base_ptr p_Var10;
  _Rb_tree_node_base *p_Var11;
  long lVar12;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_d0;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_98;
  QStringBuilder<QLatin1String,_QString> local_78;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  TVar3 = (this->m_setupUiData).policy;
  if (TVar3 == DontGenerate && emptyItemPolicy == DontConstruct) {
LAB_0012ceb2:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_0012d2a0;
  }
  if ((emptyItemPolicy == ConstructItemOnly) && ((this->m_children).d.size == 0)) {
    if (TVar3 != GenerateWithMultiDirective) {
      if (TVar3 == DontGenerate) {
        pQVar8 = (QTextStream *)QTextStream::operator<<(this->m_setupUiStream,&this->m_indent);
        pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)language::operatorNew);
        pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,&this->m_itemClassName);
        pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,'(');
        pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,parent);
        pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,')');
        QTextStream::operator<<(pQVar8,(QString *)language::eol);
        goto LAB_0012ceb2;
      }
      goto LAB_0012cef1;
    }
    generateMultiDirectiveBegin(this->m_setupUiStream,&(this->m_setupUiData).directives);
    bVar6 = true;
  }
  else {
LAB_0012cef1:
    bVar6 = false;
  }
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  this_00 = this->m_driver;
  pQVar1 = &this->m_itemClassName;
  QString::toLower_helper((QString *)&local_98);
  local_78.b.d.size = local_98.size;
  local_78.b.d.ptr = local_98.ptr;
  local_78.b.d.d = local_98.d;
  local_78.a.m_size = 2;
  local_78.a.m_data = "__";
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0x0;
  local_98.size = 0;
  QStringBuilder<QLatin1String,_QString>::convertTo<QString>((QString *)&local_50,&local_78);
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (char16_t *)0x0;
  local_b8.size = 0;
  Driver::unique(__return_storage_ptr__,this_00,(QString *)&local_50,(QString *)&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78.b.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  pQVar2 = &this->m_indent;
  QTextStream::operator<<(this->m_setupUiStream,pQVar2);
  LVar7 = language::language();
  if (LVar7 == Cpp) {
    pQVar8 = (QTextStream *)QTextStream::operator<<(this->m_setupUiStream,pQVar1);
    QTextStream::operator<<(pQVar8," *");
  }
  pQVar8 = (QTextStream *)QTextStream::operator<<(this->m_setupUiStream,__return_storage_ptr__);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8," = ");
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)language::operatorNew);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,pQVar1);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,'(');
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,parent);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,')');
  QTextStream::operator<<(pQVar8,(QString *)language::eol);
  if (bVar6) {
    QTextStream::operator<<(this->m_setupUiStream,"#else\n");
    pQVar8 = (QTextStream *)QTextStream::operator<<(this->m_setupUiStream,pQVar2);
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)language::operatorNew);
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,pQVar1);
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,'(');
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,parent);
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,')');
    QTextStream::operator<<(pQVar8,(QString *)language::eol);
    generateMultiDirectiveEnd(this->m_setupUiStream,&(this->m_setupUiData).directives);
  }
  pQVar9 = (this->m_setupUiData).setters.d.d.ptr;
  if (pQVar9 == (QMapData<std::multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
                 *)0x0) {
    p_Var10 = (_Base_ptr)0x0;
  }
  else {
    p_Var10 = *(_Base_ptr *)((long)&(pQVar9->m)._M_t._M_impl + 0x18);
  }
  while( true ) {
    p_Var11 = &(pQVar9->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (pQVar9 == (QMapData<std::multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
                   *)0x0) {
      p_Var11 = (_Rb_tree_node_base *)0x0;
    }
    if (p_Var10 == p_Var11) break;
    if (p_Var10[1]._M_left != (_Base_ptr)0x0) {
      local_78.a.m_data = (char *)p_Var10[1]._M_parent;
      local_78.a.m_size = (qsizetype)p_Var10[1]._M_left;
      language::operator<<(this->m_setupUiStream,(openQtConfig *)&local_78);
    }
    pQVar8 = (QTextStream *)QTextStream::operator<<(this->m_setupUiStream,pQVar2);
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,__return_storage_ptr__);
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)&p_Var10[1]._M_right);
    Qt::endl(pQVar8);
    if (p_Var10[1]._M_left != (_Base_ptr)0x0) {
      local_78.a.m_data = (char *)p_Var10[1]._M_parent;
      local_78.a.m_size = (qsizetype)p_Var10[1]._M_left;
      language::operator<<(this->m_setupUiStream,(closeQtConfig *)&local_78);
    }
    p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    pQVar9 = (this->m_setupUiData).setters.d.d.ptr;
  }
  ppIVar4 = (this->m_children).d.ptr;
  lVar5 = (this->m_children).d.size;
  for (lVar12 = 0; lVar5 << 3 != lVar12; lVar12 = lVar12 + 8) {
    writeSetupUi((QString *)&local_d0,*(Item **)((long)ppIVar4 + lVar12),__return_storage_ptr__,
                 ConstructItemOnly);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0012d2a0:
  __stack_chk_fail();
}

Assistant:

QString WriteInitialization::Item::writeSetupUi(const QString &parent, Item::EmptyItemPolicy emptyItemPolicy)
{
    if (emptyItemPolicy == Item::DontConstruct && m_setupUiData.policy == ItemData::DontGenerate)
        return {};

    bool generateMultiDirective = false;
    if (emptyItemPolicy == Item::ConstructItemOnly && m_children.isEmpty()) {
        if (m_setupUiData.policy == ItemData::DontGenerate) {
            m_setupUiStream << m_indent << language::operatorNew << m_itemClassName
                << '(' << parent << ')' << language::eol;
            return {};
        }
        if (m_setupUiData.policy == ItemData::GenerateWithMultiDirective)
            generateMultiDirective = true;
    }

    if (generateMultiDirective)
        generateMultiDirectiveBegin(m_setupUiStream, m_setupUiData.directives);

    const QString uniqueName = m_driver->unique("__"_L1 + m_itemClassName.toLower());
    m_setupUiStream << m_indent;
    if (language::language() == Language::Cpp)
        m_setupUiStream << m_itemClassName << " *";
    m_setupUiStream << uniqueName
        << " = " << language::operatorNew << m_itemClassName << '(' << parent
        << ')' << language::eol;

    if (generateMultiDirective) {
        m_setupUiStream << "#else\n";
        m_setupUiStream << m_indent << language::operatorNew << m_itemClassName
            << '(' << parent << ')' << language::eol;
        generateMultiDirectiveEnd(m_setupUiStream, m_setupUiData.directives);
    }

    QMultiMap<QString, QString>::ConstIterator it = m_setupUiData.setters.constBegin();
    while (it != m_setupUiData.setters.constEnd()) {
        if (!it.key().isEmpty())
            m_setupUiStream << language::openQtConfig(it.key());
        m_setupUiStream << m_indent << uniqueName << it.value() << Qt::endl;
        if (!it.key().isEmpty())
            m_setupUiStream << language::closeQtConfig(it.key());
        ++it;
    }
    for (Item *child : std::as_const(m_children))
        child->writeSetupUi(uniqueName);
    return uniqueName;
}